

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int32_t zng_inflateReset(zng_stream *strm)

{
  internal_state *piVar1;
  int iVar2;
  int32_t iVar3;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 != 0) {
    return -2;
  }
  piVar1 = strm->state;
  piVar1->w_size = 0;
  piVar1->w_mask = 0;
  piVar1->lookahead = 0;
  iVar3 = zng_inflateResetKeep(strm);
  return iVar3;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateReset)(PREFIX3(stream) *strm) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    state->wsize = 0;
    state->whave = 0;
    state->wnext = 0;
    return PREFIX(inflateResetKeep)(strm);
}